

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryKinematicsModelsLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::LibraryKinematicsModelsLoader::endTransformation(LibraryKinematicsModelsLoader *this)

{
  reference ppKVar1;
  long in_RDI;
  KinematicLink *link;
  Transformation *in_stack_ffffffffffffffd8;
  value_type transformation;
  KinematicLink *in_stack_ffffffffffffffe0;
  KinematicAttachment *this_00;
  
  if (*(long *)(in_RDI + 0x208) == 0) {
    ppKVar1 = std::
              stack<COLLADASaxFWL::KinematicLink_*,_std::deque<COLLADASaxFWL::KinematicLink_*,_std::allocator<COLLADASaxFWL::KinematicLink_*>_>_>
              ::top((stack<COLLADASaxFWL::KinematicLink_*,_std::deque<COLLADASaxFWL::KinematicLink_*,_std::allocator<COLLADASaxFWL::KinematicLink_*>_>_>
                     *)0xb1cf5a);
    transformation = *ppKVar1;
    TransformationLoader::getCurrentTransformation((TransformationLoader *)(in_RDI + 400));
    KinematicLink::addTransformation(in_stack_ffffffffffffffe0,(Transformation *)transformation);
  }
  else {
    this_00 = *(KinematicAttachment **)(in_RDI + 0x208);
    TransformationLoader::getCurrentTransformation((TransformationLoader *)(in_RDI + 400));
    KinematicAttachment::addTransformation(this_00,in_stack_ffffffffffffffd8);
  }
  IFilePartLoader::moveUpInSidTree((IFilePartLoader *)0xb1cf92);
  TransformationLoader::endTransformation((TransformationLoader *)(in_RDI + 400));
  return true;
}

Assistant:

bool LibraryKinematicsModelsLoader::endTransformation()
	{
		if ( mCurrentAttachment )
		{
			// we are a child of an attachment
			mCurrentAttachment->addTransformation( mTransformationLoader.getCurrentTransformation() );
		}
		else
		{
			// we are a child of a link
			KinematicLink* link = mLinkStack.top();
			link->addTransformation( mTransformationLoader.getCurrentTransformation() );
		}
		moveUpInSidTree();
		mTransformationLoader.endTransformation();
		return true;
	}